

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# altrace_cli.c
# Opt level: O3

void dump_callerinfo(CallerInfo *callerinfo,char *fn)

{
  void *ptr;
  char *pcVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  
  if (dump_callers == '\x01') {
    uVar3 = callerinfo->num_callstack_frames;
    if (callerinfo->trace_scope != 0) {
      uVar2 = 0;
      do {
        printf("    ");
        uVar2 = uVar2 + 1;
      } while (uVar2 < callerinfo->trace_scope);
    }
    printf("Call from threadid = %u, stack = {\n",(ulong)callerinfo->threadid);
    if (0 < (int)uVar3) {
      uVar4 = 0;
      do {
        ptr = callerinfo->callstack[uVar4].frame;
        pcVar1 = callerinfo->callstack[uVar4].sym;
        if (callerinfo->trace_scope != 0) {
          uVar2 = 0;
          do {
            printf("    ");
            uVar2 = uVar2 + 1;
          } while (uVar2 < callerinfo->trace_scope);
        }
        if (pcVar1 == (char *)0x0) {
          pcVar1 = ptrString(ptr);
        }
        printf("    %s\n",pcVar1);
        uVar4 = uVar4 + 1;
      } while (uVar4 != uVar3);
    }
    if (callerinfo->trace_scope != 0) {
      uVar3 = 0;
      do {
        printf("    ");
        uVar3 = uVar3 + 1;
      } while (uVar3 < callerinfo->trace_scope);
    }
    puts("}");
  }
  if (dump_calls != '\0') {
    return;
  }
  if (callerinfo->trace_scope != 0) {
    uVar3 = 0;
    do {
      printf("    ");
      uVar3 = uVar3 + 1;
    } while (uVar3 < callerinfo->trace_scope);
  }
  printf("%s",fn);
  return;
}

Assistant:

static void dump_callerinfo(const CallerInfo *callerinfo, const char *fn)
{
    int i;

    if (dump_callers) {
        const int frames = callerinfo->num_callstack_frames;
        int framei;
        for (i = 0; i < callerinfo->trace_scope; i++) {
            printf("    ");
        }

        printf("Call from threadid = %u, stack = {\n", (uint) callerinfo->threadid);

        for (framei = 0; framei < frames; framei++) {
            void *ptr = callerinfo->callstack[framei].frame;
            const char *str = callerinfo->callstack[framei].sym;
            for (i = 0; i < callerinfo->trace_scope; i++) {
                printf("    ");
            }
            printf("    %s\n", str ? str : ptrString(ptr));
        }

        for (i = 0; i < callerinfo->trace_scope; i++) {
            printf("    ");
        }
        printf("}\n");
    }

    if (dump_calls) {
        for (i = 0; i < callerinfo->trace_scope; i++) {
            printf("    ");
        }
        printf("%s", fn);
    }
}